

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
::resize(raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_TransparentHashIntOverload,_TransparentEqIntOverload,_std::allocator<int>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  ctrl_t *p;
  slot_type *psVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  ctrl_t *__s;
  size_t sVar3;
  ulong uVar4;
  Layout LVar5;
  FindInfo FVar6;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x807,
                  "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::DecomposePolicy, TransparentHashIntOverload, TransparentEqIntOverload, std::allocator<int>>::resize(size_t) [Policy = phmap::priv::(anonymous namespace)::DecomposePolicy, Hash = TransparentHashIntOverload, Eq = TransparentEqIntOverload, Alloc = std::allocator<int>]"
                 );
  }
  p = this->ctrl_;
  psVar1 = this->slots_;
  capacity = this->capacity_;
  LVar5 = MakeLayout(new_capacity);
  uVar4 = LVar5.
          super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::DecomposeType>
          .size_[0] + 3 & 0xfffffffffffffffc;
  __s = (ctrl_t *)
        Allocate<4ul,std::allocator<int>>
                  ((allocator<int> *)&this->settings_,
                   LVar5.
                   super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::DecomposeType>
                   .size_[1] * 4 + uVar4);
  if (((ulong)__s & 3) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<signed char, phmap::priv::(anonymous namespace)::DecomposeType>, phmap::integer_sequence<unsigned long, 0, 1>, phmap::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<signed char, phmap::priv::(anonymous namespace)::DecomposeType>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = char]"
                 );
  }
  this->ctrl_ = __s;
  this->slots_ = (slot_type *)(__s + uVar4);
  memset(__s,0x80,new_capacity + 0x10);
  this->ctrl_[new_capacity] = -1;
  reset_growth_left(this,new_capacity);
  this->capacity_ = new_capacity;
  if (capacity != 0) {
    sVar3 = 0;
    do {
      if (-1 < p[sVar3]) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)psVar1[sVar3].i;
        hashval = SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                  SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar6 = find_first_non_full(this,hashval);
        set_ctrl(this,FVar6.offset,(byte)hashval & 0x7f);
        this->slots_[FVar6.offset].i = psVar1[sVar3].i;
      }
      sVar3 = sVar3 + 1;
    } while (capacity != sVar3);
    LVar5 = MakeLayout(capacity);
    Deallocate<4ul,std::allocator<int>>
              ((allocator<int> *)&this->settings_,p,
               (LVar5.
                super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::DecomposeType>
                .size_[0] + 3 & 0xfffffffffffffffc) +
               LVar5.
               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::DecomposeType>
               .size_[1] * 4);
    return;
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }